

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall xscript::parser::ast::predict_expression_statement(ast *this)

{
  token_t_conflict tVar1;
  ast *this_local;
  
  tVar1 = (this->cur_token).type;
  if ((((tVar1 == TK_IDENTIFIER) || (tVar1 - TK_INC < 2)) || (tVar1 == TK_LEFT_PAREN)) ||
     (tVar1 == TK_CO)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ast::predict_expression_statement() {
    switch (cur_token.type){
        case tokenizer::TK_IDENTIFIER:
        case tokenizer::TK_INC:
        case tokenizer::TK_DEC:
        case tokenizer::TK_LEFT_PAREN:
        case tokenizer::TK_CO:
            return true;
        default:
            return false;
    }
}